

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O2

bool __thiscall
ON_Triangle::GetBarycentricCoordinates
          (ON_Triangle *this,ON_3dPoint *P,bool constrainInside,double *s1,double *s2)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  double *pdVar5;
  double *y;
  int iVar6;
  int iVar7;
  int i_1;
  int iVar8;
  ulong uVar9;
  int i_00;
  int i;
  ulong uVar10;
  ON_3dPoint *pOVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  double dVar14;
  double local_100;
  double local_e8;
  ON_3dPoint s;
  double t;
  ON_3dVector V_1;
  ON_3dVector W;
  ON_3dVector V;
  ON_3dVector VP;
  
  uVar12 = 0xffffffff;
  uVar13 = 0x7fefffff;
  uVar9 = 0;
  uVar10 = 0;
  pOVar11 = this->m_V;
  for (; uVar10 != 3; uVar10 = uVar10 + 1) {
    ON_3dPoint::operator-(&V_1,P,pOVar11);
    dVar14 = ON_3dVector::MaximumCoordinate(&V_1);
    if (dVar14 < (double)CONCAT44(uVar13,uVar12)) {
      uVar9 = uVar10 & 0xffffffff;
      uVar12 = SUB84(dVar14,0);
      uVar13 = (int)((ulong)dVar14 >> 0x20);
    }
    pOVar11 = pOVar11 + 1;
  }
  iVar8 = (int)uVar9;
  pOVar11 = this->m_V + iVar8;
  ON_3dPoint::operator-(&VP,P,pOVar11);
  iVar6 = (iVar8 + 1) % 3;
  ON_3dPoint::operator-(&V,this->m_V + iVar6,pOVar11);
  iVar7 = (iVar8 + 2) % 3;
  ON_3dPoint::operator-(&W,this->m_V + iVar7,pOVar11);
  ON_3dPoint::ON_3dPoint(&s,0.0,0.0,0.0);
  pdVar5 = ON_3dPoint::operator[](&s,iVar6);
  y = ON_3dPoint::operator[](&s,iVar7);
  iVar4 = ON_DecomposeVector(&VP,&V,&W,pdVar5,y);
  if (iVar4 == 0) {
    ON_Line::ON_Line((ON_Line *)&V_1,this->m_V[1],this->m_V[2]);
    ON_Line::Direction((ON_3dVector *)&t,(ON_Line *)&V_1);
    local_100 = ON_3dVector::LengthSquared((ON_3dVector *)&t);
    ON_Line::~ON_Line((ON_Line *)&V_1);
    iVar6 = 0;
    for (iVar4 = 1; iVar4 != 3; iVar4 = iVar4 + 1) {
      Edge((ON_Line *)&V_1,this,iVar4);
      ON_Line::Direction((ON_3dVector *)&t,(ON_Line *)&V_1);
      dVar14 = ON_3dVector::LengthSquared((ON_3dVector *)&t);
      ON_Line::~ON_Line((ON_Line *)&V_1);
      iVar7 = iVar4;
      if (dVar14 <= local_100) {
        dVar14 = local_100;
        iVar7 = iVar6;
      }
      local_100 = dVar14;
      iVar6 = iVar7;
    }
    Edge((ON_Line *)&V_1,this,iVar6);
    bVar2 = ON_Line::ClosestPointTo((ON_Line *)&V_1,P,&t);
    ON_Line::~ON_Line((ON_Line *)&V_1);
    if (bVar2) {
      dVar14 = 1.0 - t;
      pdVar5 = ON_3dPoint::operator[](&s,(iVar6 + 1) % 3);
      *pdVar5 = dVar14;
      pdVar5 = ON_3dPoint::operator[](&s,(iVar6 + 2) % 3);
      uVar12 = SUB84(t,0);
      uVar13 = (undefined4)((ulong)t >> 0x20);
LAB_004e35f8:
      *pdVar5 = (double)CONCAT44(uVar13,uVar12);
    }
  }
  else {
    pdVar5 = ON_3dPoint::operator[](&s,iVar6);
    local_e8 = 1.0;
    dVar14 = *pdVar5;
    pdVar5 = ON_3dPoint::operator[](&s,iVar7);
    dVar1 = *pdVar5;
    pdVar5 = ON_3dPoint::operator[](&s,iVar8);
    *pdVar5 = (1.0 - dVar14) - dVar1;
    bVar2 = true;
    if (constrainInside) {
      for (iVar4 = 0; iVar4 != 3; iVar4 = iVar4 + 1) {
        pdVar5 = ON_3dPoint::operator[](&s,iVar4);
        if (*pdVar5 <= 0.0 && *pdVar5 != 0.0) {
          Edge((ON_Line *)&V_1,this,iVar4);
          bVar3 = ON_Line::ClosestPointTo((ON_Line *)&V_1,P,&t);
          ON_Line::~ON_Line((ON_Line *)&V_1);
          if (bVar3) {
            ON_3dPoint::ON_3dPoint((ON_3dPoint *)&V_1,0.0,0.0,0.0);
            s.z = V_1.z;
            s.x = V_1.x;
            s.y = V_1.y;
            if (0.0 <= t) {
              iVar7 = 2;
              iVar6 = 0;
              iVar8 = -1;
              if (1.0 <= t) {
                local_e8 = 1.0;
              }
              else {
                dVar14 = 1.0 - t;
                iVar6 = 0;
                i_00 = iVar4 + 1;
                if (iVar4 == 2) {
                  i_00 = iVar6;
                }
                pdVar5 = ON_3dPoint::operator[](&s,i_00);
                *pdVar5 = dVar14;
                local_e8 = t;
              }
            }
            else {
              iVar7 = 0;
              iVar6 = 2;
              iVar8 = 1;
            }
            iVar8 = iVar8 + iVar4;
            if (iVar6 == iVar4) {
              iVar8 = iVar7;
            }
            pdVar5 = ON_3dPoint::operator[](&s,iVar8);
            uVar12 = SUB84(local_e8,0);
            uVar13 = (undefined4)((ulong)local_e8 >> 0x20);
            goto LAB_004e35f8;
          }
          break;
        }
      }
    }
  }
  if (s1 != (double *)0x0) {
    pdVar5 = ON_3dPoint::operator[](&s,1);
    *s1 = *pdVar5;
  }
  if (s2 != (double *)0x0) {
    pdVar5 = ON_3dPoint::operator[](&s,2);
    *s2 = *pdVar5;
  }
  return bVar2;
}

Assistant:

bool ON_Triangle::GetBarycentricCoordinates(
  const ON_3dPoint& P,
  bool constrainInside,
  double* s1, double* s2
) const
{
	bool rc = false;
	// Choose  base vertex v[i0] is closest to P
	int i0 = 0;
	double Min_norm = ON_DBL_MAX;
	for (int i = 0; i < 3; i++)
	{
		ON_3dVector V = P - m_V[i];
		double d = V.MaximumCoordinate();
		if (d < Min_norm)
		{
			i0 = i;
			Min_norm = d;
		}
	}

	ON_3dVector VP = P - m_V[i0];
	ON_3dVector V = m_V[(i0 + 1) % 3] - m_V[i0];
	ON_3dVector W = m_V[(i0 + 2) % 3] - m_V[i0];
	ON_3dPoint s(0, 0, 0);		// set to barycentric coordinates of solution

	if (ON_DecomposeVector(VP, V, W, &s[(i0 + 1) % 3], &s[(i0 + 2) % 3]))
	{
		// use decomposition
		s[i0] = 1 - s[(i0 + 1) % 3] - s[(i0 + 2) % 3];

    if (constrainInside)
		  for (int i = 0; i < 3; i++)
			  if (s[i] < 0)
			  {
				  double t;
				  if (Edge(i).ClosestPointTo(P, &t))	
				  {
					  s = ON_3dPoint( 0,0,0 );
					  if (t < 0)
					  {
						  s[(i + 1) % 3] = 1.0;
					  }

					  else if (t >= 1.0)
					  {
						  s[(i + 2) % 3] = 1.0;
					  }
					  else
					  {
						  s[(i + 1) % 3] = 1 - t;
						  s[(i + 2) % 3] = t;
					  }
				  }
				  break;
			  }
		rc = true;
	}
	else
	{
		// decomposition failed:
		// Find closest point to longest edge i0
		double max = Edge(0).Direction().LengthSquared();
    i0 = 0;
		for (int i = 1; i < 3; i++)
		{
			double lensq = Edge(i).Direction().LengthSquared();
			if (max < lensq)
			{
				i0 = i;
				max = lensq;
			}
		}
		double t;
		if (Edge(i0).ClosestPointTo(P, &t))
		{
			s[(i0 + 1) % 3] = (1 - t);
			s[(i0 + 2) % 3] = t;
			rc = true;
		}
	
	}
	if (s1)
		*s1 = s[1];
	if (s2)
		*s2 = s[2];
	return rc;
}